

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Path * __thiscall kj::Path::append(Path *__return_storage_ptr__,Path *this,PathPtr suffix)

{
  String *pSVar1;
  String *value;
  long lVar2;
  Array<kj::String> *__range1;
  size_t count;
  String *__begin1;
  ArrayBuilder<kj::String> local_88;
  Array<char> local_68;
  Array<kj::String> local_48;
  
  value = suffix.parts.ptr;
  count = (this->parts).size_ + suffix.parts.size_;
  local_88.ptr = _::HeapArrayDisposer::allocateUninitialized<kj::String>(count);
  local_88.endPtr = local_88.ptr + count;
  local_88.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pSVar1 = (this->parts).ptr;
  local_88.pos = local_88.ptr;
  for (lVar2 = (this->parts).size_ * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    ((local_88.pos)->content).ptr = (pSVar1->content).ptr;
    ((local_88.pos)->content).size_ = (pSVar1->content).size_;
    ((local_88.pos)->content).disposer = (pSVar1->content).disposer;
    (pSVar1->content).ptr = (char *)0x0;
    (pSVar1->content).size_ = 0;
    local_88.pos = local_88.pos + 1;
    pSVar1 = pSVar1 + 1;
  }
  for (lVar2 = suffix.parts.size_ * 0x18; pSVar1 = local_88.ptr, lVar2 != 0; lVar2 = lVar2 + -0x18)
  {
    heapString((String *)&local_68,value);
    ((local_88.pos)->content).ptr = local_68.ptr;
    ((local_88.pos)->content).size_ = local_68.size_;
    ((local_88.pos)->content).disposer = local_68.disposer;
    local_68.ptr = (char *)0x0;
    local_68.size_ = 0;
    local_88.pos = local_88.pos + 1;
    Array<char>::~Array(&local_68);
    value = value + 1;
  }
  lVar2 = (long)local_88.pos - (long)local_88.ptr;
  local_48.disposer = local_88.disposer;
  local_88.ptr = (String *)0x0;
  local_88.pos = (RemoveConst<kj::String> *)0x0;
  local_88.endPtr = (String *)0x0;
  (__return_storage_ptr__->parts).ptr = pSVar1;
  (__return_storage_ptr__->parts).size_ = lVar2 / 0x18;
  (__return_storage_ptr__->parts).disposer = local_88.disposer;
  local_48.ptr = (String *)0x0;
  local_48.size_ = 0;
  Array<kj::String>::~Array(&local_48);
  ArrayBuilder<kj::String>::dispose(&local_88);
  return __return_storage_ptr__;
}

Assistant:

Path Path::append(PathPtr suffix) && {
  auto newParts = kj::heapArrayBuilder<String>(parts.size() + suffix.parts.size());
  for (auto& p: parts) newParts.add(kj::mv(p));
  for (auto& p: suffix.parts) newParts.add(heapString(p));
  return Path(newParts.finish(), ALREADY_CHECKED);
}